

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O3

int __thiscall smf::MidiFile::getTrackCountAsType1(MidiFile *this)

{
  int iVar1;
  int iVar2;
  MidiEvent *pMVar3;
  int index;
  
  if (this->m_theTrackState == 1) {
    iVar1 = MidiEventList::size(*(this->m_events).
                                 super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
    if (iVar1 < 1) {
      iVar1 = 1;
    }
    else {
      index = 0;
      iVar1 = 0;
      do {
        pMVar3 = MidiEventList::operator[]
                           (*(this->m_events).
                             super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,index);
        if (iVar1 < pMVar3->track) {
          pMVar3 = MidiEventList::operator[]
                             (*(this->m_events).
                               super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                               ._M_impl.super__Vector_impl_data._M_start,index);
          iVar1 = pMVar3->track;
        }
        index = index + 1;
        iVar2 = MidiEventList::size(*(this->m_events).
                                     super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
      } while (index < iVar2);
      iVar1 = iVar1 + 1;
    }
  }
  else {
    iVar1 = (int)((ulong)((long)(this->m_events).
                                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_events).
                               super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
  }
  return iVar1;
}

Assistant:

int MidiFile::getTrackCountAsType1(void) {
	if (getTrackState() == TRACK_STATE_JOINED) {
		int output = 0;
		int i;
		for (i=0; i<(int)m_events[0]->size(); i++) {
			if (getEvent(0,i).track > output) {
				output = getEvent(0,i).track;
			}
		}
		return output+1;  // I think the track values are 0 offset...
	} else {
		return (int)m_events.size();
	}
}